

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlParserErrors
xmlParseBalancedChunkMemoryInternal
          (xmlParserCtxtPtr oldctxt,xmlChar *string,void *user_data,xmlNodePtr *lst)

{
  xmlChar xVar1;
  xmlDictPtr pxVar2;
  _xmlSAXHandler *p_Var3;
  xmlHashTablePtr pxVar4;
  int size;
  uint uVar5;
  xmlParserCtxtPtr ctxt;
  xmlChar *pxVar6;
  xmlDocPtr cur;
  xmlNodePtr cur_00;
  xmlDocPtr pxVar7;
  xmlParserErrors xVar8;
  _xmlNode *p_Var9;
  long lVar10;
  _xmlNode *local_48;
  _xmlNode *p_Stack_40;
  
  if (0x28 < oldctxt->depth) {
    if (0x400 < (uint)oldctxt->depth) {
      return XML_ERR_ENTITY_LOOP;
    }
    if ((oldctxt->options & 0x80000U) == 0) {
      return XML_ERR_ENTITY_LOOP;
    }
  }
  if (lst != (xmlNodePtr *)0x0) {
    *lst = (xmlNodePtr)0x0;
  }
  xVar8 = XML_ERR_INTERNAL_ERROR;
  if (string == (xmlChar *)0x0) {
    return XML_ERR_INTERNAL_ERROR;
  }
  size = xmlStrlen(string);
  ctxt = xmlCreateMemoryParserCtxt((char *)string,size);
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return XML_WAR_UNDECLARED_ENTITY;
  }
  if (user_data == (void *)0x0) {
    user_data = ctxt;
  }
  ctxt->userData = user_data;
  if (ctxt->dict != (xmlDictPtr)0x0) {
    xmlDictFree(ctxt->dict);
  }
  pxVar2 = oldctxt->dict;
  ctxt->dict = pxVar2;
  ctxt->input_id = oldctxt->input_id + 1;
  pxVar6 = xmlDictLookup(pxVar2,"xml",3);
  ctxt->str_xml = pxVar6;
  pxVar6 = xmlDictLookup(ctxt->dict,"xmlns",5);
  ctxt->str_xmlns = pxVar6;
  pxVar6 = xmlDictLookup(ctxt->dict,(xmlChar *)"http://www.w3.org/XML/1998/namespace",0x24);
  ctxt->str_xml_ns = pxVar6;
  if (0 < oldctxt->nsNr) {
    lVar10 = 0;
    do {
      nsPush(ctxt,oldctxt->nsTab[lVar10],oldctxt->nsTab[lVar10 + 1]);
      lVar10 = lVar10 + 2;
    } while ((int)lVar10 < oldctxt->nsNr);
  }
  p_Var3 = ctxt->sax;
  ctxt->sax = oldctxt->sax;
  xmlDetectSAX2(ctxt);
  ctxt->replaceEntities = oldctxt->replaceEntities;
  ctxt->options = oldctxt->options;
  ctxt->_private = oldctxt->_private;
  pxVar7 = oldctxt->myDoc;
  if (pxVar7 == (xmlDocPtr)0x0) {
    cur = xmlNewDoc("1.0");
    if (cur == (xmlDocPtr)0x0) {
      ctxt->sax = p_Var3;
      ctxt->dict = (xmlDictPtr)0x0;
      xmlFreeParserCtxt(ctxt);
      return XML_ERR_INTERNAL_ERROR;
    }
    cur->properties = 0x40;
    pxVar2 = ctxt->dict;
    cur->dict = pxVar2;
    xmlDictReference(pxVar2);
    ctxt->myDoc = cur;
    local_48 = (_xmlNode *)0x0;
    p_Stack_40 = (_xmlNode *)0x0;
    pxVar7 = cur;
  }
  else {
    ctxt->myDoc = pxVar7;
    local_48 = pxVar7->children;
    p_Stack_40 = pxVar7->last;
    cur = (xmlDocPtr)0x0;
  }
  cur_00 = xmlNewDocNode(pxVar7,(xmlNsPtr)0x0,(xmlChar *)"pseudoroot",(xmlChar *)0x0);
  if (cur_00 == (xmlNodePtr)0x0) {
    ctxt->sax = p_Var3;
    ctxt->dict = (xmlDictPtr)0x0;
    goto LAB_001601e4;
  }
  pxVar7 = ctxt->myDoc;
  pxVar7->children = (_xmlNode *)0x0;
  pxVar7->last = (_xmlNode *)0x0;
  xmlAddChild((xmlNodePtr)pxVar7,cur_00);
  nodePush(ctxt,ctxt->myDoc->children);
  ctxt->instate = XML_PARSER_CONTENT;
  ctxt->depth = oldctxt->depth + 1;
  ctxt->validate = 0;
  uVar5 = oldctxt->loadsubset;
  ctxt->loadsubset = uVar5;
  if ((oldctxt->validate != 0) || (oldctxt->replaceEntities != 0)) {
    ctxt->loadsubset = uVar5 | 8;
  }
  ctxt->dictNames = oldctxt->dictNames;
  pxVar4 = oldctxt->attsSpecial;
  ctxt->attsDefault = oldctxt->attsDefault;
  ctxt->attsSpecial = pxVar4;
  xmlParseContent(ctxt);
  pxVar6 = ctxt->input->cur;
  xVar1 = *pxVar6;
  if (xVar1 != '\0') {
    if ((xVar1 != '<') || (xVar8 = XML_ERR_NOT_WELL_BALANCED, pxVar6[1] != '/')) {
      xVar8 = XML_ERR_EXTRA_CONTENT;
    }
    xmlFatalErr(ctxt,xVar8,(char *)0x0);
  }
  if (ctxt->node != ctxt->myDoc->children) {
    xmlFatalErr(ctxt,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
  }
  if (ctxt->wellFormed == 0) {
    xVar8 = ctxt->errNo + (uint)(ctxt->errNo == 0);
    pxVar7 = ctxt->myDoc;
LAB_0016017a:
    if (pxVar7 != (xmlDocPtr)0x0) {
      p_Var9 = pxVar7->children;
      goto LAB_00160183;
    }
  }
  else {
    pxVar7 = ctxt->myDoc;
    if (lst == (xmlNodePtr *)0x0) {
      xVar8 = XML_ERR_OK;
      goto LAB_0016017a;
    }
    p_Var9 = pxVar7->children->children;
    *lst = p_Var9;
    if (p_Var9 != (_xmlNode *)0x0) {
      do {
        if ((((oldctxt->validate != 0) && (oldctxt->wellFormed != 0)) &&
            (pxVar7 = oldctxt->myDoc, pxVar7 != (xmlDocPtr)0x0)) &&
           ((pxVar7->intSubset != (_xmlDtd *)0x0 && (p_Var9->type == XML_ELEMENT_NODE)))) {
          uVar5 = xmlValidateElement(&oldctxt->vctxt,pxVar7,p_Var9);
          oldctxt->valid = oldctxt->valid & uVar5;
        }
        p_Var9->parent = (_xmlNode *)0x0;
        p_Var9 = p_Var9->next;
      } while (p_Var9 != (_xmlNode *)0x0);
    }
    p_Var9 = ctxt->myDoc->children;
    p_Var9->children = (_xmlNode *)0x0;
    xVar8 = XML_ERR_OK;
LAB_00160183:
    xmlFreeNode(p_Var9);
    pxVar7 = ctxt->myDoc;
    pxVar7->children = local_48;
    pxVar7->last = p_Stack_40;
  }
  oldctxt->nbentities = oldctxt->nbentities + ctxt->nbentities;
  if ((ctxt->lastError).code != 0) {
    xmlCopyError(&ctxt->lastError,&oldctxt->lastError);
  }
  ctxt->sax = p_Var3;
  ctxt->dict = (xmlDictPtr)0x0;
  ctxt->attsDefault = (xmlHashTablePtr)0x0;
  ctxt->attsSpecial = (xmlHashTablePtr)0x0;
LAB_001601e4:
  xmlFreeParserCtxt(ctxt);
  if (cur != (xmlDocPtr)0x0) {
    xmlFreeDoc(cur);
  }
  return xVar8;
}

Assistant:

static xmlParserErrors
xmlParseBalancedChunkMemoryInternal(xmlParserCtxtPtr oldctxt,
	const xmlChar *string, void *user_data, xmlNodePtr *lst) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr newDoc = NULL;
    xmlNodePtr newRoot;
    xmlSAXHandlerPtr oldsax = NULL;
    xmlNodePtr content = NULL;
    xmlNodePtr last = NULL;
    int size;
    xmlParserErrors ret = XML_ERR_OK;
#ifdef SAX2
    int i;
#endif

    if (((oldctxt->depth > 40) && ((oldctxt->options & XML_PARSE_HUGE) == 0)) ||
        (oldctxt->depth >  1024)) {
	return(XML_ERR_ENTITY_LOOP);
    }


    if (lst != NULL)
        *lst = NULL;
    if (string == NULL)
        return(XML_ERR_INTERNAL_ERROR);

    size = xmlStrlen(string);

    ctxt = xmlCreateMemoryParserCtxt((char *) string, size);
    if (ctxt == NULL) return(XML_WAR_UNDECLARED_ENTITY);
    if (user_data != NULL)
	ctxt->userData = user_data;
    else
	ctxt->userData = ctxt;
    if (ctxt->dict != NULL) xmlDictFree(ctxt->dict);
    ctxt->dict = oldctxt->dict;
    ctxt->input_id = oldctxt->input_id + 1;
    ctxt->str_xml = xmlDictLookup(ctxt->dict, BAD_CAST "xml", 3);
    ctxt->str_xmlns = xmlDictLookup(ctxt->dict, BAD_CAST "xmlns", 5);
    ctxt->str_xml_ns = xmlDictLookup(ctxt->dict, XML_XML_NAMESPACE, 36);

#ifdef SAX2
    /* propagate namespaces down the entity */
    for (i = 0;i < oldctxt->nsNr;i += 2) {
        nsPush(ctxt, oldctxt->nsTab[i], oldctxt->nsTab[i+1]);
    }
#endif

    oldsax = ctxt->sax;
    ctxt->sax = oldctxt->sax;
    xmlDetectSAX2(ctxt);
    ctxt->replaceEntities = oldctxt->replaceEntities;
    ctxt->options = oldctxt->options;

    ctxt->_private = oldctxt->_private;
    if (oldctxt->myDoc == NULL) {
	newDoc = xmlNewDoc(BAD_CAST "1.0");
	if (newDoc == NULL) {
	    ctxt->sax = oldsax;
	    ctxt->dict = NULL;
	    xmlFreeParserCtxt(ctxt);
	    return(XML_ERR_INTERNAL_ERROR);
	}
	newDoc->properties = XML_DOC_INTERNAL;
	newDoc->dict = ctxt->dict;
	xmlDictReference(newDoc->dict);
	ctxt->myDoc = newDoc;
    } else {
	ctxt->myDoc = oldctxt->myDoc;
        content = ctxt->myDoc->children;
	last = ctxt->myDoc->last;
    }
    newRoot = xmlNewDocNode(ctxt->myDoc, NULL, BAD_CAST "pseudoroot", NULL);
    if (newRoot == NULL) {
	ctxt->sax = oldsax;
	ctxt->dict = NULL;
	xmlFreeParserCtxt(ctxt);
	if (newDoc != NULL) {
	    xmlFreeDoc(newDoc);
	}
	return(XML_ERR_INTERNAL_ERROR);
    }
    ctxt->myDoc->children = NULL;
    ctxt->myDoc->last = NULL;
    xmlAddChild((xmlNodePtr) ctxt->myDoc, newRoot);
    nodePush(ctxt, ctxt->myDoc->children);
    ctxt->instate = XML_PARSER_CONTENT;
    ctxt->depth = oldctxt->depth + 1;

    ctxt->validate = 0;
    ctxt->loadsubset = oldctxt->loadsubset;
    if ((oldctxt->validate) || (oldctxt->replaceEntities != 0)) {
	/*
	 * ID/IDREF registration will be done in xmlValidateElement below
	 */
	ctxt->loadsubset |= XML_SKIP_IDS;
    }
    ctxt->dictNames = oldctxt->dictNames;
    ctxt->attsDefault = oldctxt->attsDefault;
    ctxt->attsSpecial = oldctxt->attsSpecial;

    xmlParseContent(ctxt);
    if ((RAW == '<') && (NXT(1) == '/')) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    } else if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXTRA_CONTENT, NULL);
    }
    if (ctxt->node != ctxt->myDoc->children) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    }

    if (!ctxt->wellFormed) {
        if (ctxt->errNo == 0)
	    ret = XML_ERR_INTERNAL_ERROR;
	else
	    ret = (xmlParserErrors)ctxt->errNo;
    } else {
      ret = XML_ERR_OK;
    }

    if ((lst != NULL) && (ret == XML_ERR_OK)) {
	xmlNodePtr cur;

	/*
	 * Return the newly created nodeset after unlinking it from
	 * they pseudo parent.
	 */
	cur = ctxt->myDoc->children->children;
	*lst = cur;
	while (cur != NULL) {
#ifdef LIBXML_VALID_ENABLED
	    if ((oldctxt->validate) && (oldctxt->wellFormed) &&
		(oldctxt->myDoc) && (oldctxt->myDoc->intSubset) &&
		(cur->type == XML_ELEMENT_NODE)) {
		oldctxt->valid &= xmlValidateElement(&oldctxt->vctxt,
			oldctxt->myDoc, cur);
	    }
#endif /* LIBXML_VALID_ENABLED */
	    cur->parent = NULL;
	    cur = cur->next;
	}
	ctxt->myDoc->children->children = NULL;
    }
    if (ctxt->myDoc != NULL) {
	xmlFreeNode(ctxt->myDoc->children);
        ctxt->myDoc->children = content;
        ctxt->myDoc->last = last;
    }

    /*
     * Record in the parent context the number of entities replacement
     * done when parsing that reference.
     */
    if (oldctxt != NULL)
        oldctxt->nbentities += ctxt->nbentities;

    /*
     * Also record the last error if any
     */
    if (ctxt->lastError.code != XML_ERR_OK)
        xmlCopyError(&ctxt->lastError, &oldctxt->lastError);

    ctxt->sax = oldsax;
    ctxt->dict = NULL;
    ctxt->attsDefault = NULL;
    ctxt->attsSpecial = NULL;
    xmlFreeParserCtxt(ctxt);
    if (newDoc != NULL) {
	xmlFreeDoc(newDoc);
    }

    return(ret);
}